

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

uint32_t predict_sup_adf(warm_cb *data,multi_learner *base,example *ec)

{
  uint32_t uVar1;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  uint32_t argmin;
  uint32_t in_stack_ffffffffffffffac;
  example *ec_00;
  undefined4 in_stack_ffffffffffffffbc;
  warm_cb *in_stack_ffffffffffffffc0;
  uint32_t local_1c;
  
  ec_00 = (example *)&stack0xffffffffffffffc8;
  std::vector<float,_std::allocator<float>_>::vector(unaff_retaddr,in_RDI);
  uVar1 = find_min<float>((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffffc0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffffc0);
  local_1c = uVar1;
  uVar1 = predict_sublearner_adf
                    (in_stack_ffffffffffffffc0,
                     (multi_learner *)CONCAT44(in_stack_ffffffffffffffbc,uVar1),ec_00,
                     in_stack_ffffffffffffffac);
  return uVar1;
}

Assistant:

uint32_t predict_sup_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);
	return predict_sublearner_adf(data, base, ec, argmin);
}